

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3_174.c
# Opt level: O2

Bit8u OPL3_EnvelopeCalcRate(opl3_slot_conflict *slot,Bit8u reg_rate)

{
  uint uVar1;
  opl3_channel_conflict *poVar2;
  byte bVar3;
  byte bVar4;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,reg_rate) != 0) {
    poVar2 = slot->channel;
    uVar1._0_1_ = poVar2->ksv;
    uVar1._1_1_ = poVar2->field_0x49;
    uVar1._2_2_ = poVar2->cha;
    bVar4 = (byte)(uVar1 >> 2) & 0x3f;
    if (slot->reg_ksr != '\0') {
      bVar4 = (undefined1)uVar1;
    }
    bVar4 = bVar4 + reg_rate * '\x04';
    bVar3 = 0x3c;
    if (bVar4 < 0x3c) {
      bVar3 = bVar4;
    }
    return bVar3;
  }
  return '\0';
}

Assistant:

static Bit8u OPL3_EnvelopeCalcRate(opl3_slot *slot, Bit8u reg_rate)
{
    Bit8u rate;
    if (reg_rate == 0x00)
    {
        return 0x00;
    }
    rate = (reg_rate << 2)
         + (slot->reg_ksr ? slot->channel->ksv : (slot->channel->ksv >> 2));
    if (rate > 0x3c)
    {
        rate = 0x3c;
    }
    return rate;
}